

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O1

shared_ptr<helics::Broker> __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::findObject
          (SearchableObjectHolder<helics::Broker,_helics::CoreType> *this,
          function<bool_(const_std::shared_ptr<helics::Broker>_&)> *operand)

{
  _Manager_type *pp_Var1;
  _Base_ptr p_Var2;
  char cVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::Broker> sVar6;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)operand);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  pp_Var1 = &operand[1].super__Function_base._M_manager;
  for (p_Var5 = *(_Rb_tree_node_base **)&operand[2].super__Function_base._M_functor;
      p_Var5 != (_Rb_tree_node_base *)pp_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if (*(long *)(in_RDX + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    cVar3 = (**(code **)(in_RDX + 0x18))();
    if (cVar3 != '\0') break;
  }
  if (p_Var5 == (_Rb_tree_node_base *)pp_Var1) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    *(undefined8 *)this = *(undefined8 *)(p_Var5 + 2);
    p_Var2 = p_Var5[2]._M_parent;
    *(_Base_ptr *)(this + 8) = p_Var2;
    if (p_Var2 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)operand);
  sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<helics::Broker>)
         sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<X>
        findObject(std::function<bool(const std::shared_ptr<X>&)> operand)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto obj =
            std::find_if(objectMap.begin(),
                         objectMap.end(),
                         [&operand](auto& val) { return operand(val.second); });
        if (obj != objectMap.end()) {
            return obj->second;
        }
        return nullptr;
    }